

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<double,_std::allocator<double>_> *variable,
          string *value)

{
  char *__nptr;
  vector<double,_std::allocator<double>_> *in_RSI;
  char *res;
  value_type_conflict1 *in_stack_ffffffffffffffc8;
  char *local_20 [4];
  
  local_20[0] = (char *)0x0;
  __nptr = (char *)std::__cxx11::string::c_str();
  strtod(__nptr,local_20);
  std::vector<double,_std::allocator<double>_>::push_back(in_RSI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<double>* variable,
                                            const std::string& value)
{
  char* res = nullptr;
  variable->push_back(strtod(value.c_str(), &res));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}